

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_root.h
# Opt level: O3

void __thiscall
fructose::test_root::test_assert
          (test_root *this,bool condition,string *test_case_name,char *msg,char *filename,
          int line_number)

{
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  runtime_error *this_00;
  
  this->m_assertion_tested = true;
  if (this->m_reverse_mode == condition) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error: ",7);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(test_case_name->_M_dataplus)._M_p,
                        test_case_name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," in ",4);
    if (filename == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,filename,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(",1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,line_number);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"): ",3);
    if (msg == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(msg);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,msg,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," failed.",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    iVar1 = this->m_error_count;
    this->m_error_count = iVar1 + 1;
    if (this->m_stop_on_failure == true) {
      if (-1 < iVar1) {
        this->m_error_count = iVar1;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"test assertion failed");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void set_assertion_tested()
    {
        m_assertion_tested = true;
    }